

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_panel.cxx
# Opt level: O3

Fl_Double_Window * make_code_panel(void)

{
  uint *puVar1;
  Fl_Text_Display *pFVar2;
  Fl_Double_Window *this;
  CodeEditor *pCVar3;
  Fl_Window *this_00;
  CodeEditor *this_01;
  Fl_Group *pFVar4;
  Fl_Widget *pFVar5;
  Fl_Window *this_02;
  Fl_Button *this_03;
  Fl_Group *pFVar6;
  
  this_00 = (Fl_Window *)operator_new(0xf0);
  Fl_Double_Window::Fl_Double_Window((Fl_Double_Window *)this_00,0x21c,0xb4,"Code Properties");
  code_panel = (Fl_Double_Window *)this_00;
  (this_00->super_Fl_Group).super_Fl_Widget.label_.size = 0xb;
  (this_00->super_Fl_Group).super_Fl_Widget.callback_ = cb_code_panel;
  this_01 = (CodeEditor *)operator_new(0x1c0);
  CodeEditor::CodeEditor(this_01,10,10,0x208,0x82,(char *)0x0);
  code_input = this_01;
  (this_01->super_Fl_Text_Editor).super_Fl_Text_Display.super_Fl_Group.super_Fl_Widget.box_ = '\x03'
  ;
  (this_01->super_Fl_Text_Editor).super_Fl_Text_Display.super_Fl_Group.super_Fl_Widget.color_ = 7;
  (this_01->super_Fl_Text_Editor).super_Fl_Text_Display.super_Fl_Group.super_Fl_Widget.color2_ = 0xf
  ;
  (this_01->super_Fl_Text_Editor).super_Fl_Text_Display.super_Fl_Group.super_Fl_Widget.label_.type =
       '\0';
  pFVar2 = &(this_01->super_Fl_Text_Editor).super_Fl_Text_Display;
  (pFVar2->super_Fl_Group).super_Fl_Widget.label_.font = 0;
  (pFVar2->super_Fl_Group).super_Fl_Widget.label_.size = 0xb;
  (this_01->super_Fl_Text_Editor).super_Fl_Text_Display.super_Fl_Group.super_Fl_Widget.label_.color
       = 0;
  (this_01->super_Fl_Text_Editor).super_Fl_Text_Display.textfont_ = 4;
  (this_01->super_Fl_Text_Editor).super_Fl_Text_Display.mColumnScale = 0.0;
  CodeEditor::textsize(this_01,0xb);
  pCVar3 = code_input;
  (code_input->super_Fl_Text_Editor).super_Fl_Text_Display.super_Fl_Group.super_Fl_Widget.label_.
  align_ = 1;
  (pCVar3->super_Fl_Text_Editor).super_Fl_Text_Display.super_Fl_Group.super_Fl_Widget.when_ = '\x04'
  ;
  pFVar4 = Fl_Group::current();
  pFVar4->resizable_ = (Fl_Widget *)code_input;
  (this_01->super_Fl_Text_Editor).super_Fl_Text_Display.super_Fl_Group.super_Fl_Widget.when_ =
       '\x0f';
  pFVar4 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar4,10,0x96,0x208,0x14,(char *)0x0);
  (pFVar4->super_Fl_Widget).label_.size = 0xb;
  pFVar5 = (Fl_Widget *)operator_new(0x80);
  Fl_Return_Button::Fl_Return_Button((Fl_Return_Button *)pFVar5,400,0x96,0x3c,0x14,"OK");
  code_panel_ok = (Fl_Return_Button *)pFVar5;
  (pFVar5->label_).size = 0xb;
  this_02 = Fl_Widget::window(pFVar5);
  Fl_Window::hotspot(this_02,(Fl_Widget *)code_panel_ok,0);
  this_03 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(this_03,0x1d6,0x96,0x3c,0x14,"Cancel");
  code_panel_cancel = this_03;
  (this_03->super_Fl_Widget).label_.size = 0xb;
  pFVar5 = (Fl_Widget *)operator_new(0x78);
  Fl_Box::Fl_Box((Fl_Box *)pFVar5,10,0x96,0x17c,0x14,(char *)0x0);
  (pFVar5->label_).size = 0xb;
  pFVar6 = Fl_Group::current();
  pFVar6->resizable_ = pFVar5;
  Fl_Group::end(pFVar4);
  this_00->minw = 200;
  this_00->minh = 0x96;
  this_00->maxw = 0;
  this_00->maxh = 0;
  this_00->dw = 0;
  this_00->dh = 0;
  this_00->aspect = 0;
  Fl_Window::size_range_(this_00);
  this = code_panel;
  puVar1 = &(code_panel->super_Fl_Window).super_Fl_Group.super_Fl_Widget.flags_;
  *puVar1 = *puVar1 | 0x4000;
  Fl_Group::end((Fl_Group *)this);
  Fl_Text_Display::linenumber_width((Fl_Text_Display *)code_input,0x3c);
  Fl_Text_Display::linenumber_size
            ((Fl_Text_Display *)code_input,
             (code_input->super_Fl_Text_Editor).super_Fl_Text_Display.textsize_);
  return code_panel;
}

Assistant:

Fl_Double_Window* make_code_panel() {
  { Fl_Double_Window* o = code_panel = new Fl_Double_Window(540, 180, "Code Properties");
    code_panel->labelsize(11);
    code_panel->callback((Fl_Callback*)cb_code_panel);
    { CodeEditor* o = code_input = new CodeEditor(10, 10, 520, 130);
      code_input->box(FL_DOWN_BOX);
      code_input->color(FL_BACKGROUND2_COLOR);
      code_input->selection_color(FL_SELECTION_COLOR);
      code_input->labeltype(FL_NORMAL_LABEL);
      code_input->labelfont(0);
      code_input->labelsize(11);
      code_input->labelcolor(FL_FOREGROUND_COLOR);
      code_input->textfont(4);
      code_input->textsize(11);
      code_input->align(Fl_Align(FL_ALIGN_TOP));
      code_input->when(FL_WHEN_RELEASE);
      Fl_Group::current()->resizable(code_input);
      o->when(FL_WHEN_ENTER_KEY_CHANGED|FL_WHEN_RELEASE);
    } // CodeEditor* code_input
    { Fl_Group* o = new Fl_Group(10, 150, 520, 20);
      o->labelsize(11);
      { code_panel_ok = new Fl_Return_Button(400, 150, 60, 20, "OK");
        code_panel_ok->labelsize(11);
        code_panel_ok->window()->hotspot(code_panel_ok);
      } // Fl_Return_Button* code_panel_ok
      { code_panel_cancel = new Fl_Button(470, 150, 60, 20, "Cancel");
        code_panel_cancel->labelsize(11);
      } // Fl_Button* code_panel_cancel
      { Fl_Box* o = new Fl_Box(10, 150, 380, 20);
        o->labelsize(11);
        Fl_Group::current()->resizable(o);
      } // Fl_Box* o
      o->end();
    } // Fl_Group* o
    o->size_range(200, 150);
    code_panel->set_modal();
    code_panel->end();
  } // Fl_Double_Window* code_panel
  // Enable line numbers
  code_input->linenumber_width(60);
  code_input->linenumber_size(code_input->Fl_Text_Display::textsize());
  return code_panel;
}